

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O0

void GREATEST_PRINT_REPORT(void)

{
  char *pcVar1;
  
  if ((greatest_info.flags & 2) == 0) {
    update_counts_and_reset_suite();
    greatest_info.end = clock();
    if (greatest_info.end == -1) {
      fprintf(_stdout,"clock error: %s\n","greatest_info.end");
      exit(1);
    }
    pcVar1 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar1 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar1);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            (double)(greatest_info.end - greatest_info.begin) / 1000000.0,
            greatest_info.end - greatest_info.begin);
    pcVar1 = "s";
    if (greatest_info.assertions == 1) {
      pcVar1 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar1);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
  }
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}